

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O0

void __thiscall xmrig::Miner::setEnabled(Miner *this,bool enabled)

{
  byte bVar1;
  byte in_SIL;
  long in_RDI;
  
  bVar1 = in_SIL & 1;
  if ((*(byte *)(*(long *)(in_RDI + 0x18) + 1) & 1) != bVar1) {
    *(byte *)(*(long *)(in_RDI + 0x18) + 1) = bVar1;
    if (bVar1 == 0) {
      Log::print(INFO,"\x1b[1;33mpaused\x1b[0m, press \x1b[45;1m r \x1b[0m to resume");
    }
    else {
      Log::print(INFO,"\x1b[1;32mresumed\x1b[0m");
    }
    if ((**(byte **)(in_RDI + 0x18) & 1) != 0) {
      Nonce::pause((Nonce *)(ulong)((bVar1 ^ 0xff) & 1));
      Nonce::touch();
    }
  }
  return;
}

Assistant:

void xmrig::Miner::setEnabled(bool enabled)
{
    if (d_ptr->enabled == enabled) {
        return;
    }

    d_ptr->enabled = enabled;

    if (enabled) {
        LOG_INFO(GREEN_BOLD("resumed"));
    }
    else {
        LOG_INFO(YELLOW_BOLD("paused") ", press " MAGENTA_BG_BOLD(" r ") " to resume");
    }

    if (!d_ptr->active) {
        return;
    }

    Nonce::pause(!enabled);
    Nonce::touch();
}


void xmrig::Miner::setJob(const Job &job)
{
    for (IBackend *backend : d_ptr->backends) {
        backend->prepare(job);
    }

    mutex.lock();

    const uint8_t index = 0;

    d_ptr->reset = !(d_ptr->job.index() == 1 && index == 0 && d_ptr->userJobId == job.id());
    d_ptr->job   = job;
    d_ptr->job.setIndex(index);

    if (index == 0) {
        d_ptr->userJobId = job.id();
    }

    mutex.unlock();
    d_ptr->handleJobChange();
}


void xmrig::Miner::stop()
{
    Nonce::stop();

    for (IBackend *backend : d_ptr->backends) {
        backend->stop();
    }
}


void xmrig::Miner::onConfigChanged(Config *config, Config *previousConfig)
{
    if (config->pools() != previousConfig->pools() && config->pools().active() > 0) {
        return;
    }

    const Job job = this->job();

    for (IBackend *backend : d_ptr->backends) {
        backend->setJob(job);
    }
}


void xmrig::Miner::onTimer(const Timer *)
{
    double maxHashrate = 0.0;

    for (IBackend *backend : d_ptr->backends) {
        backend->tick(d_ptr->ticks);

        if (backend->hashrate()) {
            maxHashrate += backend->hashrate()->calc(Hashrate::ShortInterval);
        }
    }

    d_ptr->maxHashrate = std::max(d_ptr->maxHashrate, maxHashrate);

    auto seconds = d_ptr->controller->config()->printTime();
    if (seconds && (d_ptr->ticks % (seconds * 2)) == 0) {
        printHashrate(false);
    }

    d_ptr->ticks++;
}


#ifdef XMRIG_FEATURE_API
void xmrig::Miner::onRequest(IApiRequest &request)
{
    if (request.method() == IApiRequest::METHOD_GET) {
        if (request.type() == IApiRequest::REQ_SUMMARY) {
            request.accept();

            d_ptr->getMiner(request.reply(), request.doc(), request.version());
            d_ptr->getHashrate(request.reply(), request.doc(), request.version());
        }
        else if (request.url() == "/2/backends") {
            request.accept();

            d_ptr->getBackends(request.reply(), request.doc());
        }
    }
    else if (request.type() == IApiRequest::REQ_JSON_RPC) {
        if (request.rpcMethod() == "pause") {
            request.accept();

            setEnabled(false);
        }
        else if (request.rpcMethod() == "resume") {
            request.accept();

            setEnabled(true);
        }
        else if (request.rpcMethod() == "stop") {
            request.accept();

            stop();
        }
    }

    for (IBackend *backend : d_ptr->backends) {
        backend->handleRequest(request);
    }
}
#endif